

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void cppcms::util::urlencode_impl<std::back_insert_iterator<std::__cxx11::string>>
               (char *b,char *e,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               out)

{
  int iVar1;
  byte *pbVar2;
  byte *in_RSI;
  byte *in_RDI;
  uchar uc;
  char c;
  char *in_stack_ffffffffffffff98;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_32;
  byte local_31;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  byte local_19;
  byte *local_18;
  byte *local_10;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  while (local_10 != local_18) {
    pbVar2 = local_10 + 1;
    local_19 = *local_10;
    local_10 = pbVar2;
    if (((((char)local_19 < 'a') || ('z' < (char)local_19)) &&
        (((char)local_19 < 'A' || ('Z' < (char)local_19)))) &&
       (((char)local_19 < '0' || ('9' < (char)local_19)))) {
      iVar1 = (int)(char)local_19;
      if (((iVar1 - 0x2dU < 2) || (iVar1 == 0x5f)) || (iVar1 == 0x7e)) {
        local_30 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_8,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_30);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        local_32 = 0x25;
        local_31 = local_19;
        local_40 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_8,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_40);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff98 = "0123456789abcdef" + ((int)(uint)local_31 >> 4);
        local_48 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_8,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_48);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa0 =
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)("0123456789abcdef" + (int)(local_31 & 0xf));
        local_50 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_8,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    else {
      local_28 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_8,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_28);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

void urlencode_impl(char const *b,char const *e,Iterator out)
{
	while(b!=e){
		char c=*b++;
		if(	('a'<=c && c<='z')
			|| ('A'<=c && c<='Z')
			|| ('0'<=c && c<='9'))
		{
			*out++ = c;
		}
		else {
			switch(c) {
				case '-':
				case '_':
				case '.':
				case '~':
					*out++ = c;
					break;
				default:
				{
					static char const hex[]="0123456789abcdef";
					unsigned char uc = c;
					*out++ = '%';
					*out++ = hex[(uc >> 4) & 0xF];
					*out++ = hex[ uc & 0xF];
					
				}
			};
		}
	};
}